

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventAgentTest.cpp
# Opt level: O2

void __thiscall TestClass::AsyncFunc2(TestClass *this,uint32_t p1,int16_t p2)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)
           operator_new(0x38,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/eventAgentTest.cpp"
                        ,0x3d);
  puVar1[1] = 0xfffffffb00000000;
  *(undefined4 *)(puVar1 + 2) = 0;
  *puVar1 = &PTR_onRefCountZero_00110388;
  puVar1[3] = this;
  puVar1[4] = handleAsyncFunc2;
  puVar1[5] = 0;
  *(uint32_t *)(puVar1 + 6) = p1;
  *(int16_t *)((long)puVar1 + 0x34) = p2;
  (**(code **)(*(long *)&this->mEventThread + 8))(&this->mEventThread,puVar1);
  return;
}

Assistant:

void AsyncFunc2(uint32_t p1, int16_t p2)
	{
		AsyncEventAgent2<TestClass, uint32_t, int16_t> *agent =
			jh_new AsyncEventAgent2<TestClass, uint32_t, int16_t>(this, &TestClass::handleAsyncFunc2,
				p1, p2);
		agent->send(&mEventThread);
	}